

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O1

vec_3d unit_vec(vec_3d *a)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vec_3d vVar7;
  
  fVar3 = a->z * a->z + a->y * a->y + a->x * a->x;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  if (1e-09 <= ABS(fVar3)) {
    if ((fVar3 != 1.0) || (NAN(fVar3))) {
      uVar1 = a->x;
      uVar2 = a->y;
      auVar5._4_4_ = uVar2;
      auVar5._0_4_ = uVar1;
      auVar5._8_8_ = 0;
      auVar6._4_4_ = fVar3;
      auVar6._0_4_ = fVar3;
      auVar6._8_4_ = fVar3;
      auVar6._12_4_ = fVar3;
      auVar6 = divps(auVar5,auVar6);
      uVar4 = auVar6._0_8_;
      fVar3 = a->z / fVar3;
      goto LAB_0010193c;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"unit_vec",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": Division by zero.",0x13);
  }
  fVar3 = 0.0;
  uVar4 = 0;
LAB_0010193c:
  vVar7.z = fVar3;
  vVar7.x = (float)(int)uVar4;
  vVar7.y = (float)(int)((ulong)uVar4 >> 0x20);
  return vVar7;
}

Assistant:

vec_3d unit_vec(const vec_3d *a) {
    float norm = ~(*a);
    vec_3d result = {0.f};

    if (fabsf(norm) < LIBQUAT_EPSILON) {
        std::cerr << __func__ << ": Division by zero.";
        return result;
    }

    if (norm != 1.F)  // perform division only if needed
    {
        result.x = a->x / norm;
        result.y = a->y / norm;
        result.z = a->z / norm;
    }

    return result;
}